

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# on_off_sketch.h
# Opt level: O0

void __thiscall
OO_FPI<8U>::Check(OO_FPI<8U> *this,HashMap<8U> *mp,
                 vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                 *outs)

{
  bool bVar1;
  pointer ppVar2;
  int *piVar3;
  const_reference ppbVar4;
  ostream *poVar5;
  int iVar6;
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  *in_RDX;
  long in_RDI;
  double dVar7;
  int size;
  int hit;
  int all;
  int value;
  iterator it;
  unordered_map<Data<8U>,_int,_My_Hash<8U>,_std::equal_to<Data<8U>_>,_std::allocator<std::pair<const_Data<8U>,_int>_>_>
  *in_stack_ffffffffffffff68;
  _Node_iterator<std::pair<const_Data<8U>,_int>,_false,_true> *in_stack_ffffffffffffff70;
  OO_FPI<8U> *in_stack_ffffffffffffff78;
  Data<8U> in_stack_ffffffffffffff80;
  int local_50 [2];
  undefined8 local_48;
  _Node_iterator_base<std::pair<const_Data<8U>,_int>,_true> local_40;
  _Node_iterator_base<std::pair<const_Data<8U>,_int>,_true> local_38;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  _Node_iterator_base<std::pair<const_Data<8U>,_int>,_true> local_20;
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  *local_18;
  
  local_18 = in_RDX;
  std::__detail::_Node_iterator<std::pair<const_Data<8U>,_int>,_false,_true>::_Node_iterator
            ((_Node_iterator<std::pair<const_Data<8U>,_int>,_false,_true> *)0x11583b);
  local_24 = 0;
  local_28 = 0;
  local_2c = 0;
  local_30 = 0;
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<Data<8U>,_int,_My_Hash<8U>,_std::equal_to<Data<8U>_>,_std::allocator<std::pair<const_Data<8U>,_int>_>_>
       ::begin(in_stack_ffffffffffffff68);
  local_20._M_cur = local_38._M_cur;
  while( true ) {
    local_40._M_cur =
         (__node_type *)
         std::
         unordered_map<Data<8U>,_int,_My_Hash<8U>,_std::equal_to<Data<8U>_>,_std::allocator<std::pair<const_Data<8U>,_int>_>_>
         ::end(in_stack_ffffffffffffff68);
    bVar1 = std::__detail::operator!=(&local_20,&local_40);
    if (!bVar1) break;
    ppVar2 = std::__detail::_Node_iterator<std::pair<const_Data<8U>,_int>,_false,_true>::operator->
                       ((_Node_iterator<std::pair<const_Data<8U>,_int>,_false,_true> *)0x1158a5);
    local_48 = *(undefined8 *)(ppVar2->first).str;
    local_24 = Query(in_stack_ffffffffffffff78,in_stack_ffffffffffffff80);
    ppVar2 = std::__detail::_Node_iterator<std::pair<const_Data<8U>,_int>,_false,_true>::operator->
                       ((_Node_iterator<std::pair<const_Data<8U>,_int>,_false,_true> *)0x1158ca);
    if ((*(int *)(in_RDI + 0x90) < ppVar2->second) &&
       (local_28 = local_28 + 1, *(int *)(in_RDI + 0x90) < local_24)) {
      local_2c = local_2c + 1;
      ppVar2 = std::__detail::_Node_iterator<std::pair<const_Data<8U>,_int>,_false,_true>::
               operator->((_Node_iterator<std::pair<const_Data<8U>,_int>,_false,_true> *)0x115913);
      iVar6 = ppVar2->second - local_24;
      if (iVar6 < 1) {
        iVar6 = -iVar6;
      }
      *(double *)(in_RDI + 0x38) = (double)iVar6 + *(double *)(in_RDI + 0x38);
      ppVar2 = std::__detail::_Node_iterator<std::pair<const_Data<8U>,_int>,_false,_true>::
               operator->((_Node_iterator<std::pair<const_Data<8U>,_int>,_false,_true> *)0x115941);
      iVar6 = ppVar2->second - local_24;
      if (iVar6 < 1) {
        iVar6 = -iVar6;
      }
      ppVar2 = std::__detail::_Node_iterator<std::pair<const_Data<8U>,_int>,_false,_true>::
               operator->((_Node_iterator<std::pair<const_Data<8U>,_int>,_false,_true> *)0x115963);
      *(double *)(in_RDI + 0x40) =
           (double)iVar6 / (double)ppVar2->second + *(double *)(in_RDI + 0x40);
    }
    if (*(int *)(in_RDI + 0x90) < local_24) {
      local_30 = local_30 + 1;
    }
    std::__detail::_Node_iterator<std::pair<const_Data<8U>,_int>,_false,_true>::operator++
              (in_stack_ffffffffffffff70);
  }
  *(double *)(in_RDI + 0x38) = *(double *)(in_RDI + 0x38) / (double)local_2c;
  *(double *)(in_RDI + 0x40) = *(double *)(in_RDI + 0x40) / (double)local_2c;
  dVar7 = (double)local_2c;
  local_50[1] = 1;
  piVar3 = std::max<int>(local_50 + 1,&local_28);
  *(double *)(in_RDI + 0x30) = dVar7 / (double)*piVar3;
  dVar7 = (double)local_2c;
  local_50[0] = 1;
  piVar3 = std::max<int>(local_50,&local_30);
  *(double *)(in_RDI + 0x28) = dVar7 / (double)*piVar3;
  ppbVar4 = std::
            vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
            ::operator[](local_18,0);
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)*ppbVar4,*(double *)(in_RDI + 0x30));
  std::operator<<(poVar5,",");
  ppbVar4 = std::
            vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
            ::operator[](local_18,1);
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)*ppbVar4,*(double *)(in_RDI + 0x28));
  std::operator<<(poVar5,",");
  ppbVar4 = std::
            vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
            ::operator[](local_18,2);
  if (1e-09 <= *(double *)(in_RDI + 0x28) + *(double *)(in_RDI + 0x30)) {
    dVar7 = *(double *)(in_RDI + 0x28) + *(double *)(in_RDI + 0x30);
  }
  else {
    dVar7 = 1.0;
  }
  poVar5 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)*ppbVar4,
                      (*(double *)(in_RDI + 0x28) * 2.0 * *(double *)(in_RDI + 0x30)) / dVar7);
  std::operator<<(poVar5,",");
  ppbVar4 = std::
            vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
            ::operator[](local_18,3);
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)*ppbVar4,*(double *)(in_RDI + 0x40));
  std::operator<<(poVar5,",");
  return;
}

Assistant:

void Check(HashMap<DATA_LEN> mp, const std::vector<std::ostream*>& outs) {
		typename HashMap<DATA_LEN>::iterator it;
		int value = 0, all = 0, hit = 0, size = 0;
		for (it = mp.begin(); it != mp.end(); ++it) {
			value = Query(it->first);
			if (it->second > this->HIT) {
				all++;
				if (value > this->HIT) {
					hit += 1;
					this->aae += abs(it->second - value);
					this->are += abs(it->second - value) / (double)it->second;
				}
			}
			if (value > this->HIT) size += 1;
		}
		this->aae /= hit;
		this->are /= hit;
		this->cr = hit / (double)std::max(1, all);
		this->pr = hit / (double)std::max(1, size);
		*outs[0] << this->cr << ",";
		*outs[1] << this->pr << ",";
		*outs[2] << 2 * this->pr * this->cr / ((this->pr + this->cr < 1e-9) ? 1.0 : this->pr + this->cr) << ",";
		*outs[3] << this->are << ",";
	}